

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Table * sqlite3FindTable(sqlite3 *db,char *zName,char *zDatabase)

{
  Db *pDVar1;
  int iVar2;
  Table *p;
  Table *pTVar3;
  uint uVar4;
  uint uVar5;
  
  do {
    for (uVar4 = 0; (int)uVar4 < db->nDb; uVar4 = uVar4 + 1) {
      uVar5 = uVar4 < 2 ^ uVar4;
      pDVar1 = db->aDb;
      if (((zDatabase == (char *)0x0) ||
          (iVar2 = sqlite3StrICmp(zDatabase,pDVar1[uVar5].zDbSName), iVar2 == 0)) &&
         (pTVar3 = (Table *)sqlite3HashFind(&(pDVar1[uVar5].pSchema)->tblHash,zName),
         pTVar3 != (Table *)0x0)) {
        return pTVar3;
      }
    }
    iVar2 = sqlite3StrICmp(zName,"sqlite_master");
    if (iVar2 != 0) {
      return (Table *)0x0;
    }
    iVar2 = sqlite3_stricmp(zDatabase,db->aDb[1].zDbSName);
    zName = "sqlite_temp_master";
  } while (iVar2 == 0);
  return (Table *)0x0;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3FindTable(sqlite3 *db, const char *zName, const char *zDatabase){
  Table *p = 0;
  int i;

  /* All mutexes are required for schema access.  Make sure we hold them. */
  assert( zDatabase!=0 || sqlite3BtreeHoldsAllMutexes(db) );
#if SQLITE_USER_AUTHENTICATION
  /* Only the admin user is allowed to know that the sqlite_user table
  ** exists */
  if( db->auth.authLevel<UAUTH_Admin && sqlite3UserAuthTable(zName)!=0 ){
    return 0;
  }
#endif
  while(1){
    for(i=OMIT_TEMPDB; i<db->nDb; i++){
      int j = (i<2) ? i^1 : i;   /* Search TEMP before MAIN */
      if( zDatabase==0 || sqlite3StrICmp(zDatabase, db->aDb[j].zDbSName)==0 ){
        assert( sqlite3SchemaMutexHeld(db, j, 0) );
        p = sqlite3HashFind(&db->aDb[j].pSchema->tblHash, zName);
        if( p ) return p;
      }
    }
    /* Not found.  If the name we were looking for was temp.sqlite_master
    ** then change the name to sqlite_temp_master and try again. */
    if( sqlite3StrICmp(zName, MASTER_NAME)!=0 ) break;
    if( sqlite3_stricmp(zDatabase, db->aDb[1].zDbSName)!=0 ) break;
    zName = TEMP_MASTER_NAME;
  }
  return 0;
}